

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::RegisteredLoggers::unsafeFlushAll(RegisteredLoggers *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (_Rb_tree_node_base *)
                (this->m_logStreamsReference)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_logStreamsReference)._M_t._M_impl.super__Rb_tree_header
      ; p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(long *)(p_Var1 + 2) != 0) {
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void RegisteredLoggers::unsafeFlushAll(void) {
  ELPP_INTERNAL_INFO(1, "Flushing all log files");
  for (base::LogStreamsReferenceMap::iterator it = m_logStreamsReference.begin();
       it != m_logStreamsReference.end(); ++it) {
    if (it->second.get() == nullptr) continue;
    it->second->flush();
  }
}